

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O2

attr_list libcmudp_LTX_non_blocking_listen
                    (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
                    attr_list listen_info)

{
  void *pvVar1;
  atom_t aVar2;
  uint uVar3;
  int iVar4;
  uint __fd;
  attr_list p_Var5;
  char *pcVar6;
  ulong uVar7;
  int int_port_num;
  sockaddr local_5c;
  int one;
  transport_entry_conflict local_48;
  void *local_40;
  uint nl;
  
  pvVar1 = trans->trans_data;
  int_port_num = 0;
  one = 1;
  uVar3 = get_self_ip_addr(cm,svc);
  if (listen_info == (attr_list)0x0) {
    uVar7 = 0;
  }
  else {
    iVar4 = query_attr(listen_info,CM_UDP_PORT,0,&int_port_num);
    if (iVar4 == 0) {
      (*svc->trace_out)(cm,"CMUDP transport found no UDP_PORT attribute");
      int_port_num = 0;
      goto LAB_00103464;
    }
    uVar7 = (ulong)(uint)int_port_num;
    if (0xffff < (uint)int_port_num) {
      fprintf(_stderr,"Requested port number %d is invalid\n");
      return (attr_list)0x0;
    }
  }
  (*svc->trace_out)(cm,"CMUDP transport connect to port %d",uVar7);
LAB_00103464:
  __fd = socket(2,2,0);
  if ((int)__fd < 0) {
    pcVar6 = "socket";
  }
  else {
    local_5c.sa_data[6] = '\0';
    local_5c.sa_data[7] = '\0';
    local_5c.sa_data[8] = '\0';
    local_5c.sa_data[9] = '\0';
    local_5c.sa_data[10] = '\0';
    local_5c.sa_data[0xb] = '\0';
    local_5c.sa_data[0xc] = '\0';
    local_5c.sa_data[0xd] = '\0';
    local_5c.sa_family = 2;
    local_5c.sa_data[2] = '\0';
    local_5c.sa_data[3] = '\0';
    local_5c.sa_data[4] = '\0';
    local_5c.sa_data[5] = '\0';
    local_5c.sa_data._0_2_ = (ushort)int_port_num << 8 | (ushort)int_port_num >> 8;
    iVar4 = setsockopt(__fd,1,0xf,&one,4);
    if (iVar4 == -1) {
      perror("setsockopt reuseport");
    }
    iVar4 = bind(__fd,&local_5c,0x10);
    if (-1 < iVar4) {
      nl = 0x10;
      local_48 = trans;
      local_40 = pvVar1;
      iVar4 = getsockname(__fd,&local_5c,&nl);
      if (iVar4 != 0) {
        perror("getsockname");
      }
      local_5c.sa_data._2_4_ =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      p_Var5 = (attr_list)create_attr_list();
      add_attr(p_Var5,CM_UDP_ADDR,1,(long)(int)uVar3);
      add_attr(p_Var5,CM_UDP_PORT,1,
               local_5c.sa_data._0_2_ << 8 | (ushort)local_5c.sa_data._0_2_ >> 8);
      aVar2 = CM_TRANSPORT;
      pcVar6 = strdup("udp");
      add_attr(p_Var5,aVar2,3,pcVar6);
      (*svc->trace_out)(cm,"CMudp Adding libcmudp_data_available as action on fd %d",(ulong)__fd);
      (*svc->fd_add_select)(cm,__fd,libcmudp_data_available,local_48,(void *)(ulong)__fd);
      *(uint *)((long)local_40 + 0x10) = __fd;
      *(uint *)((long)local_40 + 0x14) = uVar3;
      *(uint *)((long)local_40 + 0x18) =
           (uint)(ushort)(local_5c.sa_data._0_2_ << 8 | (ushort)local_5c.sa_data._0_2_ >> 8);
      return p_Var5;
    }
    pcVar6 = "bind";
  }
  perror(pcVar6);
  exit(1);
}

Assistant:

extern attr_list
libcmudp_LTX_non_blocking_listen(CManager cm, CMtrans_services svc, transport_entry trans, attr_list listen_info)
{
    udp_transport_data_ptr utd = trans->trans_data;
    int int_port_num = 0;
    u_short port_num;
    attr_list listen_list;
    unsigned int nl;
    int one = 1;
    SOCKET socket_fd;
    struct sockaddr_in addr;
    int IP = get_self_ip_addr(cm, svc);

    if (listen_info != NULL &&
	(!query_attr(listen_info, CM_UDP_PORT, /* type pointer */ NULL,
		     (attr_value *) (intptr_t) &int_port_num))) {
	svc->trace_out(cm, "CMUDP transport found no UDP_PORT attribute");
	int_port_num = 0;
    } else {
	if (int_port_num > USHRT_MAX || int_port_num < 0) {
	    fprintf(stderr, "Requested port number %d is invalid\n", int_port_num);
	    return NULL;
	}
	svc->trace_out(cm, "CMUDP transport connect to port %d", int_port_num);
    }
    if ((socket_fd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
	perror("socket");
	exit(1);
    }
    port_num = int_port_num;

    memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = htonl(INADDR_ANY);	/* N.B.: differs from *
						 * sender */
    addr.sin_port = htons(port_num);
#ifdef SO_REUSEPORT
    if (setsockopt(socket_fd, SOL_SOCKET, SO_REUSEPORT, (char *) &one, sizeof(one)) == -1) {
	perror("setsockopt reuseport");
    }
#else
    if (setsockopt(socket_fd, SOL_SOCKET, SO_REUSEADDR, (char *) &one, sizeof(one)) == -1) {
	perror("setsockopt reuseport");
    }
#endif
    /* bind to receive address */
    if (bind(socket_fd, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
	perror("bind");
	exit(1);
    }
    nl = sizeof(struct sockaddr_in);
    if (getsockname(socket_fd, (struct sockaddr *) &addr, &nl) != 0)
	perror("getsockname");
    

    addr.sin_addr.s_addr = htonl(IP);
    listen_list = create_attr_list();
    add_attr(listen_list, CM_UDP_ADDR, Attr_Int4,
	     (attr_value) (long)IP);
    add_attr(listen_list, CM_UDP_PORT, Attr_Int4,
	     (attr_value) (long) ntohs(addr.sin_port));
    add_attr(listen_list, CM_TRANSPORT, Attr_String,
	     (attr_value) strdup("udp"));
    svc->trace_out(cm, "CMudp Adding libcmudp_data_available as action on fd %d", socket_fd);
    svc->fd_add_select(cm, socket_fd, libcmudp_data_available,
		       (void *) trans, (void *) (intptr_t)socket_fd);
    utd->socket_fd = socket_fd;
    utd->self_ip = IP;
    utd->self_port = ntohs(addr.sin_port);
    return listen_list;
}